

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall QRhiGles2::setPipelineCacheData(QRhiGles2 *this,QByteArray *data)

{
  int *piVar1;
  int iVar2;
  QLoggingCategory *pQVar3;
  size_t __n;
  ulong uVar4;
  QHash<QByteArray,_QRhiGles2::PipelineCacheData> *this_00;
  uint uVar5;
  uint *puVar6;
  void *__src;
  char *pcVar7;
  PipelineCacheData *pPVar8;
  ulong uVar9;
  quint32 i;
  uint uVar10;
  long in_FS_OFFSET;
  QByteArray local_198;
  QByteArray local_178;
  PipelineCacheData local_158;
  PipelineCacheData local_138 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (data->d).size;
  if (uVar4 == 0) goto LAB_00564ca4;
  if (uVar4 < 0x100) {
    pQVar3 = QtPrivateLogging::QRHI_LOG_INFO();
    if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) goto LAB_00564ca4;
    local_138[0].data.d.size = (qsizetype)pQVar3->name;
    pPVar8 = local_138;
    local_138[0].format = 2;
    local_138[0]._4_8_ = 0;
    local_138[0].data.d._4_8_ = 0;
    local_138[0].data.d.ptr._4_4_ = 0;
    pcVar7 = "setPipelineCacheData: Invalid blob size (header incomplete)";
LAB_00564b4b:
    QMessageLogger::debug((char *)pPVar8,pcVar7);
  }
  else {
    pcVar7 = (data->d).ptr;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    memcpy(local_138,pcVar7,0x100);
    uVar10 = local_138[0].format;
    uVar5 = (this->super_QRhiImplementation).implType << 0x18 | 0x60a00;
    if (local_138[0].format == uVar5) {
      uVar10 = local_138[0]._4_4_;
      if (local_138[0]._4_4_ == 8) {
        if ((uint)local_138[0].data.d.d == 0) goto LAB_00564ca4;
        pcVar7 = (this->driverInfoStruct).deviceName.d.ptr;
        uVar9 = (this->driverInfoStruct).deviceName.d.size;
        __n = 0xef;
        if (uVar9 < 0xef) {
          __n = uVar9;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)&QByteArray::_empty;
        }
        iVar2 = strncmp((char *)&local_138[0].data.d.ptr,pcVar7,__n);
        if (iVar2 == 0) {
          if ((local_138[0].data.d._4_8_ & 0xffffffff) + 0x100 <= uVar4) {
            this_00 = &this->m_pipelineCache;
            QHash<QByteArray,_QRhiGles2::PipelineCacheData>::clear(this_00);
            pcVar7 = (data->d).ptr;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)&QByteArray::_empty;
            }
            puVar6 = (uint *)(pcVar7 + 0x100);
            uVar10 = 0;
            do {
              uVar4 = (ulong)*puVar6;
              local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_178.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray(&local_178,uVar4,Uninitialized);
              if ((&(local_178.d.d)->super_QArrayData == (QArrayData *)0x0) ||
                 (1 < ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i)) {
                QByteArray::reallocData((longlong)&local_178,(AllocationOption)local_178.d.size);
              }
              puVar6 = puVar6 + 1;
              memcpy(local_178.d.ptr,puVar6,uVar4);
              uVar9 = (ulong)*(uint *)((long)puVar6 + uVar4);
              local_198.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_198.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_198.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray(&local_198,uVar9,Uninitialized);
              if ((&(local_198.d.d)->super_QArrayData == (QArrayData *)0x0) ||
                 (1 < ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i)) {
                QByteArray::reallocData((longlong)&local_198,(AllocationOption)local_198.d.size);
              }
              __src = (void *)((long)puVar6 + uVar4 + 4);
              memcpy(local_198.d.ptr,__src,uVar9);
              local_158.format = *(quint32 *)((long)__src + uVar9);
              local_158.data.d.d._0_4_ = SUB84(local_198.d.d,0);
              local_158.data.d.d._4_4_ = (undefined4)((ulong)local_198.d.d >> 0x20);
              local_158.data.d.ptr._0_4_ = SUB84(local_198.d.ptr,0);
              local_158.data.d.ptr._4_4_ = (undefined4)((ulong)local_198.d.ptr >> 0x20);
              local_158.data.d.size = local_198.d.size;
              if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
              }
              QHash<QByteArray,QRhiGles2::PipelineCacheData>::
              emplace<QRhiGles2::PipelineCacheData_const&>
                        ((QHash<QByteArray,QRhiGles2::PipelineCacheData> *)this_00,&local_178,
                         &local_158);
              piVar1 = (int *)CONCAT44(local_158.data.d.d._4_4_,local_158.data.d.d._0_4_);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)
                             CONCAT44(local_158.data.d.d._4_4_,local_158.data.d.d._0_4_),1,0x10);
                }
              }
              if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,1,0x10);
                }
              }
              puVar6 = (uint *)((long)__src + uVar9 + 4);
              uVar10 = uVar10 + 1;
            } while (uVar10 < (uint)local_138[0].data.d.d);
            pQVar3 = QtPrivateLogging::QRHI_LOG_INFO();
            if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              local_158.data.d.size = (qsizetype)pQVar3->name;
              local_158.format = 2;
              local_158._4_4_ = 0;
              local_158.data.d.d._0_4_ = 0;
              local_158.data.d.d._4_4_ = 0;
              local_158.data.d.ptr._0_4_ = 0;
              local_158.data.d.ptr._4_4_ = 0;
              if (this_00->d == (Data *)0x0) {
                uVar4 = 0;
              }
              else {
                uVar4 = (ulong)(uint)this_00->d->size;
              }
              QMessageLogger::debug
                        ((char *)&local_158,"Seeded pipeline cache with %d program binaries",uVar4);
            }
            goto LAB_00564ca4;
          }
          pQVar3 = QtPrivateLogging::QRHI_LOG_INFO();
          if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0)
          goto LAB_00564ca4;
          local_158.data.d.size = (qsizetype)pQVar3->name;
          pPVar8 = &local_158;
          local_158.format = 2;
          local_158._4_4_ = 0;
          local_158.data.d.d._0_4_ = 0;
          local_158.data.d.d._4_4_ = 0;
          local_158.data.d.ptr._0_4_ = 0;
          local_158.data.d.ptr._4_4_ = 0;
          pcVar7 = "setPipelineCacheData: Invalid blob size (data incomplete)";
        }
        else {
          pQVar3 = QtPrivateLogging::QRHI_LOG_INFO();
          if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0)
          goto LAB_00564ca4;
          local_158.data.d.size = (qsizetype)pQVar3->name;
          pPVar8 = &local_158;
          local_158.format = 2;
          local_158._4_4_ = 0;
          local_158.data.d.d._0_4_ = 0;
          local_158.data.d.d._4_4_ = 0;
          local_158.data.d.ptr._0_4_ = 0;
          local_158.data.d.ptr._4_4_ = 0;
          pcVar7 = "setPipelineCacheData: OpenGL vendor/renderer/version does not match";
        }
        goto LAB_00564b4b;
      }
      pQVar3 = QtPrivateLogging::QRHI_LOG_INFO();
      if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) goto LAB_00564ca4;
      local_158.data.d.size = (qsizetype)pQVar3->name;
      pcVar7 = "setPipelineCacheData: Architecture does not match (%u, %u)";
      uVar4 = 8;
    }
    else {
      pQVar3 = QtPrivateLogging::QRHI_LOG_INFO();
      if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) goto LAB_00564ca4;
      local_158.data.d.size = (qsizetype)pQVar3->name;
      pcVar7 = "setPipelineCacheData: The data is for a different QRhi version or backend (%u, %u)";
      uVar4 = (ulong)uVar5;
    }
    local_158.data.d.ptr._4_4_ = 0;
    local_158.data.d.ptr._0_4_ = 0;
    local_158.data.d.d._4_4_ = 0;
    local_158.data.d.d._0_4_ = 0;
    local_158._4_4_ = 0;
    local_158.format = 2;
    QMessageLogger::debug((char *)&local_158,pcVar7,uVar4,(ulong)uVar10);
  }
LAB_00564ca4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::setPipelineCacheData(const QByteArray &data)
{
    if (data.isEmpty())
        return;

    const size_t headerSize = sizeof(QGles2PipelineCacheDataHeader);
    if (data.size() < qsizetype(headerSize)) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: Invalid blob size (header incomplete)");
        return;
    }
    const size_t dataOffset = headerSize;
    QGles2PipelineCacheDataHeader header;
    memcpy(&header, data.constData(), headerSize);

    const quint32 rhiId = pipelineCacheRhiId();
    if (header.rhiId != rhiId) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: The data is for a different QRhi version or backend (%u, %u)",
                rhiId, header.rhiId);
        return;
    }
    const quint32 arch = quint32(sizeof(void*));
    if (header.arch != arch) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: Architecture does not match (%u, %u)",
                arch, header.arch);
        return;
    }
    if (header.programBinaryCount == 0)
        return;

    const size_t driverStrLen = qMin(sizeof(header.driver) - 1, size_t(driverInfoStruct.deviceName.size()));
    if (strncmp(header.driver, driverInfoStruct.deviceName.constData(), driverStrLen)) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: OpenGL vendor/renderer/version does not match");
        return;
    }

    if (data.size() < qsizetype(dataOffset + header.dataSize)) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: Invalid blob size (data incomplete)");
        return;
    }

    m_pipelineCache.clear();

    const char *p = data.constData() + dataOffset;
    for (quint32 i = 0; i < header.programBinaryCount; ++i) {
        quint32 len = 0;
        memcpy(&len, p, 4);
        p += 4;
        QByteArray key(len, Qt::Uninitialized);
        memcpy(key.data(), p, len);
        p += len;

        memcpy(&len, p, 4);
        p += 4;
        QByteArray data(len, Qt::Uninitialized);
        memcpy(data.data(), p, len);
        p += len;

        quint32 format;
        memcpy(&format, p, 4);
        p += 4;

        m_pipelineCache.insert(key, { format, data });
    }

    qCDebug(QRHI_LOG_INFO, "Seeded pipeline cache with %d program binaries", int(m_pipelineCache.size()));
}